

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

buffer_appender<char> __thiscall
fmt::v7::detail::write<char,char,fmt::v7::detail::buffer_appender<char>>
          (detail *this,buffer_appender<char> out,basic_string_view<char> s,
          basic_format_specs<char> *specs)

{
  byte bVar1;
  uint uVar2;
  buffer_appender<char> bVar3;
  uint *puVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  buffer<char> *buf;
  ulong uVar8;
  size_t size;
  char *pcVar9;
  
  puVar4 = (uint *)s.size_;
  pcVar6 = s.data_;
  uVar8 = (ulong)*puVar4;
  uVar2 = puVar4[1];
  pcVar9 = (char *)(ulong)uVar2;
  if (pcVar6 <= (char *)(ulong)uVar2) {
    pcVar9 = pcVar6;
  }
  if ((int)uVar2 < 0) {
    pcVar9 = pcVar6;
  }
  if (pcVar9 == (char *)0x0 || uVar8 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    pcVar6 = (char *)0x0;
    do {
      uVar5 = uVar5 + 1;
      pcVar6 = pcVar6 + 1;
    } while (pcVar9 != pcVar6);
  }
  uVar7 = 0;
  if (uVar5 <= uVar8) {
    uVar7 = uVar8 - uVar5;
  }
  bVar1 = *(byte *)((long)&basic_data<void>::left_padding_shifts +
                   (ulong)(*(byte *)((long)puVar4 + 9) & 0xf));
  if (*(char **)(this + 0x18) <
      pcVar9 + *(byte *)((long)puVar4 + 0xe) * uVar7 + *(long *)(this + 0x10)) {
    (*(code *)**(undefined8 **)this)(this);
  }
  uVar8 = uVar7 >> (bVar1 & 0x3f);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)this,uVar8,(fill_t<char> *)((long)puVar4 + 10));
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,fmt::v7::detail::buffer_appender<char>>
                    ((char *)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container,
                     pcVar9 + (long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container,bVar3);
  bVar3 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    (bVar3,uVar7 - uVar8,(fill_t<char> *)((long)puVar4 + 10));
  return (buffer_appender<char>)
         bVar3.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write(OutputIt out, basic_string_view<StrChar> s,
               const basic_format_specs<Char>& specs) {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width = specs.width != 0
                   ? count_code_points(basic_string_view<StrChar>(data, size))
                   : 0;
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, width, [=](iterator it) {
    return copy_str<Char>(data, data + size, it);
  });
}